

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O2

path * __thiscall ghc::filesystem::path::append<char[1]>(path *this,char (*source) [1])

{
  format fmt;
  path local_50;
  string local_30;
  
  detail::toUtf8<char>(&local_30,*source);
  path(&local_50,&local_30,fmt);
  operator/=(this,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_30);
  return this;
}

Assistant:

inline path& path::append(const Source& source)
{
    return this->operator/=(path(detail::toUtf8(source)));
}